

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homology.h
# Opt level: O0

void print_homology_usage(bool no_filtration)

{
  bool bVar1;
  ostream *poVar2;
  reference pbVar3;
  void *this;
  byte in_DIL;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> f;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff98;
  ostream *in_stack_ffffffffffffffa0;
  string local_40 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_10;
  byte local_1;
  
  local_1 = in_DIL & 1;
  poVar2 = std::operator<<((ostream *)&std::cerr,
                           "  --cache folder     cache the coboundary matrix in the given folder");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  if ((local_1 & 1) == 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "  --filtration       use the specified algorithm to compute the filtration. Options are:"
                            );
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    local_10 = &custom_filtration_computer_abi_cxx11_;
    local_18._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(in_stack_ffffffffffffff98);
    local_20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(in_stack_ffffffffffffff98);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_ffffffffffffffa0,
                              (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_ffffffffffffff98), bVar1) {
      pbVar3 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_18);
      std::__cxx11::string::string(local_40,(string *)pbVar3);
      poVar2 = std::operator<<((ostream *)&std::cerr,"                         ");
      in_stack_ffffffffffffffa0 = std::operator<<(poVar2,local_40);
      std::ostream::operator<<(in_stack_ffffffffffffffa0,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_40);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_18);
    }
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,
                           "  --max-dim          the maximal homology dimension to be computed");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,
                           "  --min-dim          the minimal homology dimension to be computed");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,
                           "  --modulus          compute homology with coefficients in the prime field Z/<p>Z"
                          );
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,
                           "  --approximate n    skip all columns creating columns in the reduction matrix with"
                          );
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,
                           "                     n non-trivial entries. Use this for hard problems, a good value"
                          );
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,
                           "                     is often 100000. Increase for higher precision, decrease for faster computation."
                          );
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,
                           "  --threads          number of threads to use for the computation (default: number of threads that your machine can execute simultaneously)"
                          );
  this = (void *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void print_homology_usage(bool no_filtration = false) {
	std::cerr << "  --cache folder     cache the coboundary matrix in the given folder" << std::endl;
	if (!no_filtration) {
		std::cerr << "  --filtration       use the specified algorithm to compute the filtration. Options are:"
		          << std::endl;

		for (auto f : custom_filtration_computer) std::cerr << "                         " << f << std::endl;
	}

	std::cerr << "  --max-dim          the maximal homology dimension to be computed" << std::endl
	          << "  --min-dim          the minimal homology dimension to be computed" << std::endl
#ifdef USE_COEFFICIENTS
	          << "  --modulus          compute homology with coefficients in the prime field Z/<p>Z" << std::endl
#endif
	          << "  --approximate n    skip all columns creating columns in the reduction matrix with" << std::endl
	          << "                     n non-trivial entries. Use this for hard problems, a good value" << std::endl
	          << "                     is often 100000. Increase for higher precision, decrease for faster computation." << std::endl
	          << "  --threads          number of threads to use for the computation (default: number of threads that your machine can execute simultaneously)" << std::endl
	          << std::endl;
}